

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.h
# Opt level: O1

HMInteger __thiscall hypermind::CompileUnit::CreateLable(CompileUnit *this)

{
  uint uVar1;
  VM *pVVar2;
  HMUINT32 HVar3;
  uint *puVar4;
  uint v;
  
  uVar1 = (this->mLables).capacity;
  v = (this->mLables).count + 1;
  if (uVar1 < v) {
    pVVar2 = this->mVM;
    HVar3 = CeilToPowerOf2(v);
    (this->mLables).capacity = HVar3;
    puVar4 = (uint *)GCHeap::MemManger(&pVVar2->mGCHeap,(this->mLables).data,(ulong)uVar1 << 2,
                                       (ulong)HVar3 << 2);
    (this->mLables).data = puVar4;
  }
  uVar1 = (this->mLables).count;
  (this->mLables).count = uVar1 + 1;
  (this->mLables).data[uVar1] = 0;
  return (this->mLables).count - 1;
}

Assistant:

HMInteger CreateLable() {
            return mLables.push(&mVM->mGCHeap, 0);
        }